

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::AssertSnapEquiv_SnapPromiseInfo
               (SnapObject *sobj1,SnapObject *sobj2,TTDCompareMap *compareMap)

{
  SnapPromiseInfo *pSVar1;
  SnapPromiseInfo *pSVar2;
  uint local_38;
  uint local_34;
  uint32 i_1;
  uint32 i;
  SnapPromiseInfo *promiseInfo2;
  SnapPromiseInfo *promiseInfo1;
  TTDCompareMap *compareMap_local;
  SnapObject *sobj2_local;
  SnapObject *sobj1_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
                     (sobj1);
  pSVar2 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseInfo*,(TTD::NSSnapObjects::SnapObjectType)28>
                     (sobj2);
  NSSnapValues::AssertSnapEquivTTDVar_Special(pSVar1->Result,pSVar2->Result,compareMap,L"result");
  TTDCompareMap::DiagnosticAssert
            (compareMap,pSVar1->ResolveReactionCount == pSVar2->ResolveReactionCount);
  for (local_34 = 0; local_34 < pSVar1->ResolveReactionCount; local_34 = local_34 + 1) {
    NSSnapValues::AssertSnapEquiv
              (pSVar1->ResolveReactions + local_34,pSVar2->ResolveReactions + local_34,compareMap);
  }
  TTDCompareMap::DiagnosticAssert
            (compareMap,pSVar1->RejectReactionCount == pSVar2->RejectReactionCount);
  for (local_38 = 0; local_38 < pSVar1->RejectReactionCount; local_38 = local_38 + 1) {
    NSSnapValues::AssertSnapEquiv
              (pSVar1->RejectReactions + local_38,pSVar2->RejectReactions + local_38,compareMap);
  }
  return;
}

Assistant:

void AssertSnapEquiv_SnapPromiseInfo(const SnapObject* sobj1, const SnapObject* sobj2, TTDCompareMap& compareMap)
        {
            const SnapPromiseInfo* promiseInfo1 = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(sobj1);
            const SnapPromiseInfo* promiseInfo2 = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(sobj2);

            NSSnapValues::AssertSnapEquivTTDVar_Special(promiseInfo1->Result, promiseInfo2->Result, compareMap, _u("result"));

            compareMap.DiagnosticAssert(promiseInfo1->ResolveReactionCount == promiseInfo2->ResolveReactionCount);
            for(uint32 i = 0; i < promiseInfo1->ResolveReactionCount; ++i)
            {
                NSSnapValues::AssertSnapEquiv(promiseInfo1->ResolveReactions + i, promiseInfo2->ResolveReactions + i, compareMap);
            }

            compareMap.DiagnosticAssert(promiseInfo1->RejectReactionCount == promiseInfo2->RejectReactionCount);
            for(uint32 i = 0; i < promiseInfo1->RejectReactionCount; ++i)
            {
                NSSnapValues::AssertSnapEquiv(promiseInfo1->RejectReactions + i, promiseInfo2->RejectReactions + i, compareMap);
            }
        }